

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O3

int regexec(regex_t *__preg,char *__string,size_t __nmatch,regmatch_t *__pmatch,int __eflags)

{
  char cVar1;
  re_guts *prVar2;
  sopno stop;
  size_t sVar3;
  sop *psVar4;
  undefined8 uVar5;
  re_guts *prVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  regmatch_t rVar12;
  char *pcVar13;
  ushort **ppuVar14;
  char *pcVar15;
  char *pcVar16;
  long lVar17;
  char *pcVar18;
  regmatch_t *prVar19;
  ushort *puVar20;
  char *pcVar21;
  ushort uVar22;
  int iVar23;
  ulong uVar24;
  sop sVar25;
  long lVar26;
  ulong uVar27;
  regmatch_t *__ptr;
  int iVar28;
  int iVar29;
  char *pcVar30;
  long lVar31;
  undefined8 *puVar32;
  long lVar33;
  char *pcVar34;
  long lVar35;
  long lVar36;
  bool bVar37;
  uint local_118;
  char *local_f8;
  char *local_d8;
  lmat local_b8;
  size_t local_48;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  if (*(int *)&__preg->buffer != 0xf265) {
    return 2;
  }
  prVar2 = (re_guts *)__preg->syntax;
  if (prVar2->magic != 0xd245) {
    return 2;
  }
  if ((prVar2->iflags & 4) != 0) {
    return 2;
  }
  uVar27 = prVar2->nstates;
  local_b8.g = prVar2;
  local_b8.offp = __string;
  if (0x20 < uVar27) {
    lVar35 = prVar2->firststate;
    stop = prVar2->laststate;
    uVar24 = 0;
    if ((prVar2->cflags & 4) == 0) {
      uVar24 = __nmatch;
    }
    if ((__eflags & 4U) == 0) {
      rVar12 = (regmatch_t)strlen(__string);
      pcVar30 = __string;
    }
    else {
      pcVar30 = __string + (long)*__pmatch;
      rVar12 = __pmatch[1];
    }
    pcVar13 = __string + (long)rVar12;
    lVar36 = (long)pcVar13 - (long)pcVar30;
    if (pcVar13 < pcVar30) {
      return 0x10;
    }
    pcVar18 = prVar2->must;
    if (pcVar18 != (char *)0x0) {
      pcVar34 = pcVar30;
      if (pcVar30 < pcVar13) {
        cVar1 = *pcVar18;
        do {
          if (((*pcVar34 == cVar1) && (prVar2->mlen <= lVar36)) &&
             (iVar7 = bcmp(pcVar34,pcVar18,(long)prVar2->mlen), iVar7 == 0)) break;
          pcVar34 = pcVar34 + 1;
          lVar36 = lVar36 + -1;
        } while (pcVar34 < pcVar13);
      }
      if (pcVar34 == pcVar13) {
        return 1;
      }
    }
    local_b8.eflags = __eflags & 7;
    local_b8.pmatch = (regmatch_t *)0x0;
    local_b8.lastpos = (char **)0x0;
    local_b8.beginp = pcVar30;
    local_b8.endp = pcVar13;
    prVar19 = (regmatch_t *)malloc(uVar27 * 4);
    if (prVar19 == (regmatch_t *)0x0) {
      return 0xc;
    }
    lVar35 = lVar35 + 1;
    local_b8.st._0_4_ = SUB84(prVar19,0);
    local_b8.st._4_4_ = (undefined4)((ulong)prVar19 >> 0x20);
    pcVar18 = (char *)((long)&prVar19->rm_so + uVar27);
    local_d8 = (char *)((long)&prVar19->rm_so + uVar27 * 2);
    local_b8.vn = 4;
    local_b8.empty = (char *)((long)&prVar19->rm_so + uVar27 * 3);
    local_b8.space = (char *)prVar19;
    local_b8.fresh = pcVar18;
    local_b8.tmp = local_d8;
    memset(local_b8.empty,0,uVar27);
    pcVar34 = pcVar30;
LAB_001079e7:
    if (pcVar34 == pcVar30) {
      iVar7 = 0x80;
    }
    else {
      iVar7 = (int)pcVar30[-1];
    }
    memset(prVar19,0,(local_b8.g)->nstates);
    *(char *)((long)&prVar19->rm_so + lVar35) = '\x01';
    lstep(local_b8.g,lVar35,stop,(char *)prVar19,0x84,(char *)prVar19);
    memcpy(pcVar18,prVar19,(local_b8.g)->nstates);
    local_f8 = (char *)0x0;
    do {
      prVar6 = local_b8.g;
      if (pcVar30 == local_b8.endp) {
        iVar11 = 0x80;
      }
      else {
        iVar11 = (int)*pcVar30;
      }
      iVar23 = bcmp(prVar19,pcVar18,(local_b8.g)->nstates);
      if (iVar23 == 0) {
        local_f8 = pcVar30;
      }
      iVar23 = 0;
      iVar9 = 0x82;
      if (iVar7 == 0x80) {
        iVar29 = 0;
        if ((local_b8.eflags & 1U) == 0) {
LAB_00107ad3:
          iVar29 = prVar6->nbol;
          iVar23 = 0x81;
          iVar9 = 0x83;
        }
      }
      else if (iVar7 == 10) {
        iVar29 = 0;
        if ((prVar6->cflags & 8) != 0) goto LAB_00107ad3;
      }
      else {
        iVar29 = 0;
      }
      if (iVar11 == 0x80) {
        if ((local_b8.eflags & 2U) == 0) goto LAB_00107b0b;
      }
      else if ((iVar11 == 10) && ((prVar6->cflags & 8) != 0)) {
LAB_00107b0b:
        iVar29 = iVar29 + prVar6->neol;
        iVar23 = iVar9;
      }
      if (0 < iVar29) {
        uVar8 = iVar29 + 1;
        do {
          lstep(local_b8.g,lVar35,stop,(char *)prVar19,iVar23,(char *)prVar19);
          uVar8 = uVar8 - 1;
        } while (1 < uVar8);
      }
      if (iVar23 == 0x81) {
        iVar9 = 0x81;
        if (iVar11 != 0x80) {
          ppuVar14 = __ctype_b_loc();
          puVar20 = *ppuVar14;
LAB_00107ba3:
          if (iVar11 == 0x5f) {
            iVar23 = 0x85;
          }
          iVar9 = iVar23;
          if ((puVar20[iVar11] & 8) != 0) {
            iVar9 = 0x85;
          }
        }
        iVar23 = iVar9;
        if (iVar7 == 0x80) goto LAB_00107bf3;
        ppuVar14 = __ctype_b_loc();
        puVar20 = *ppuVar14;
        uVar22 = puVar20[iVar7] & 8;
LAB_00107be9:
        if (((uVar22 == 0) && (iVar7 != 0x5f)) ||
           ((iVar7 = 0x86, iVar23 != 0x82 &&
            (((iVar11 == 0x80 || ((puVar20[iVar11] & 8) != 0)) || (iVar11 == 0x5f))))))
        goto LAB_00107bf3;
LAB_00107c15:
        lstep(local_b8.g,lVar35,stop,(char *)prVar19,iVar7,(char *)prVar19);
      }
      else {
        if (iVar7 != 0x80) {
          ppuVar14 = __ctype_b_loc();
          puVar20 = *ppuVar14;
          uVar22 = puVar20[iVar7] & 8;
          if (((uVar22 == 0) && (iVar7 != 0x5f)) && (iVar11 != 0x80)) goto LAB_00107ba3;
          goto LAB_00107be9;
        }
LAB_00107bf3:
        iVar7 = iVar23;
        if (iVar7 - 0x85U < 2) goto LAB_00107c15;
      }
      if ((pcVar30 == pcVar13) || (*(char *)((long)&prVar19->rm_so + stop) != '\0'))
      goto LAB_00107cd9;
      memcpy(local_d8,prVar19,(local_b8.g)->nstates);
      memcpy(prVar19,pcVar18,(local_b8.g)->nstates);
      lstep(local_b8.g,lVar35,stop,local_d8,iVar11,(char *)prVar19);
      pcVar30 = pcVar30 + 1;
      iVar7 = iVar11;
    } while( true );
  }
  lVar35 = prVar2->firststate;
  lVar36 = prVar2->laststate;
  local_48 = 0;
  if ((prVar2->cflags & 4) == 0) {
    local_48 = __nmatch;
  }
  local_118 = __eflags & 7;
  if ((__eflags & 4U) == 0) {
    rVar12 = (regmatch_t)strlen(__string);
    pcVar30 = __string;
  }
  else {
    pcVar30 = __string + (long)*__pmatch;
    rVar12 = __pmatch[1];
  }
  pcVar13 = __string + (long)rVar12;
  lVar33 = (long)pcVar13 - (long)pcVar30;
  if (pcVar13 < pcVar30) {
    return 0x10;
  }
  pcVar18 = prVar2->must;
  if (pcVar18 != (char *)0x0) {
    pcVar34 = pcVar30;
    if (pcVar30 < pcVar13) {
      cVar1 = *pcVar18;
      do {
        if (((*pcVar34 == cVar1) && (prVar2->mlen <= lVar33)) &&
           (iVar7 = bcmp(pcVar34,pcVar18,(long)prVar2->mlen), iVar7 == 0)) break;
        pcVar34 = pcVar34 + 1;
        lVar33 = lVar33 + -1;
      } while (pcVar34 < pcVar13);
    }
    if (pcVar34 == pcVar13) {
      return 1;
    }
  }
  lVar35 = lVar35 + 1;
  local_b8.eflags = local_118;
  local_b8.pmatch = (regmatch_t *)0x0;
  local_b8.lastpos = (char **)0x0;
  local_38 = 1 << ((byte)lVar35 & 0x1f);
  local_3c = 1 << ((byte)lVar36 & 0x1f);
  local_b8._68_4_ = 0;
  local_b8.space = (char *)0x0;
  local_b8.st._0_4_ = 0;
  local_b8.beginp = pcVar30;
  local_b8.endp = pcVar13;
LAB_00107100:
  prVar6 = local_b8.g;
  if (local_b8.beginp == pcVar30) {
    iVar7 = 0x80;
  }
  else {
    iVar7 = (int)pcVar30[-1];
  }
  uVar8 = sstep(local_b8.g,lVar35,lVar36,local_38,0x84,local_38);
  pcVar34 = local_b8.endp;
  iVar11 = local_b8.eflags;
  pcVar18 = (char *)0x0;
  uVar10 = uVar8;
  local_34 = uVar8;
  do {
    if (pcVar30 == pcVar34) {
      iVar23 = 0x80;
    }
    else {
      iVar23 = (int)*pcVar30;
    }
    if (uVar10 == uVar8) {
      pcVar18 = pcVar30;
    }
    iVar9 = 0;
    iVar29 = 0x82;
    if (iVar7 == 0x80) {
      iVar28 = 0;
      iVar9 = 0;
      if ((iVar11 & 1U) == 0) {
LAB_001071b3:
        iVar28 = prVar6->nbol;
        iVar29 = 0x83;
        iVar9 = 0x81;
      }
    }
    else if (iVar7 == 10) {
      iVar28 = 0;
      if ((prVar6->cflags & 8) != 0) goto LAB_001071b3;
    }
    else {
      iVar28 = 0;
      iVar9 = 0;
    }
    if (iVar23 == 0x80) {
      if ((iVar11 & 2U) == 0) goto LAB_001071e8;
    }
    else if ((iVar23 == 10) && ((prVar6->cflags & 8) != 0)) {
LAB_001071e8:
      iVar28 = iVar28 + prVar6->neol;
      iVar9 = iVar29;
    }
    if (0 < iVar28) {
      uVar8 = iVar28 + 1;
      do {
        uVar10 = sstep(prVar6,lVar35,lVar36,uVar10,iVar9,uVar10);
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
    }
    if (iVar9 == 0x81) {
      iVar29 = 0x81;
      if (iVar23 != 0x80) {
        ppuVar14 = __ctype_b_loc();
        puVar20 = *ppuVar14;
LAB_001072a7:
        if (iVar23 == 0x5f) {
          iVar9 = 0x85;
        }
        iVar29 = iVar9;
        if ((puVar20[iVar23] & 8) != 0) {
          iVar29 = 0x85;
        }
      }
      iVar9 = iVar29;
      if (iVar7 == 0x80) goto LAB_001072fc;
      ppuVar14 = __ctype_b_loc();
      puVar20 = *ppuVar14;
      uVar22 = puVar20[iVar7] & 8;
LAB_001072f1:
      if (((uVar22 == 0) && (iVar7 != 0x5f)) ||
         ((iVar7 = 0x86, iVar9 != 0x82 &&
          (((iVar23 == 0x80 || ((puVar20[iVar23] & 8) != 0)) || (iVar23 == 0x5f))))))
      goto LAB_001072fc;
LAB_0010731a:
      uVar10 = sstep(prVar6,lVar35,lVar36,uVar10,iVar7,uVar10);
    }
    else {
      if (iVar7 != 0x80) {
        ppuVar14 = __ctype_b_loc();
        puVar20 = *ppuVar14;
        uVar22 = puVar20[iVar7] & 8;
        if (((uVar22 == 0) && (iVar7 != 0x5f)) && (iVar23 != 0x80)) goto LAB_001072a7;
        goto LAB_001072f1;
      }
LAB_001072fc:
      iVar7 = iVar9;
      if (iVar9 - 0x85U < 2) goto LAB_0010731a;
    }
    uVar8 = local_34;
    if ((pcVar30 == pcVar13) || ((uVar10 & local_3c) != 0)) goto LAB_001073ad;
    uVar10 = sstep(prVar6,lVar35,lVar36,uVar10,iVar23,local_34);
    pcVar30 = pcVar30 + 1;
    iVar7 = iVar23;
  } while( true );
LAB_00107cd9:
  local_b8.coldp = local_f8;
  if (*(char *)((long)&prVar19->rm_so + stop) == '\0') {
    iVar7 = 1;
    prVar19 = (regmatch_t *)local_b8.space;
  }
  else {
    if ((uVar24 == 0) && (prVar2->backrefs == 0)) goto LAB_001082ac;
    pcVar30 = lslow(&local_b8,local_f8,pcVar13,lVar35,stop);
    if (pcVar30 == (char *)0x0) {
      do {
        local_b8.coldp = local_b8.coldp + 1;
        pcVar30 = lslow(&local_b8,local_b8.coldp,pcVar13,lVar35,stop);
      } while (pcVar30 == (char *)0x0);
    }
    if ((uVar24 == 1) && (prVar2->backrefs == 0)) goto LAB_00108248;
    sVar3 = (local_b8.g)->nsub;
    if ((local_b8.pmatch != (regmatch_t *)0x0) ||
       (local_b8.pmatch = (regmatch_t *)malloc(sVar3 * 0x10 + 0x10),
       local_b8.pmatch != (regmatch_t *)0x0)) {
      __ptr = local_b8.pmatch;
      if (sVar3 != 0) {
        memset(local_b8.pmatch + 1,0xff,sVar3 << 4);
      }
      if ((prVar2->backrefs == 0) &&
         (lVar36 = lVar35, pcVar18 = local_b8.coldp, (local_b8.eflags & 0x400U) == 0)) {
joined_r0x00107ddb:
        pcVar34 = pcVar18;
        if (lVar36 < stop) {
          sVar25 = (local_b8.g)->strip[lVar36];
          uVar8 = (uint)sVar25;
          uVar10 = uVar8 & 0x7c000000;
          if (((ulong)uVar10 == 0x24000000) || (uVar10 == 0x2c000000)) {
            lVar33 = (ulong)(uVar8 & 0x3ffffff) + lVar36;
          }
          else {
            lVar33 = lVar36;
            if (uVar10 == 0x3c000000) {
              do {
                lVar33 = lVar33 + (ulong)((uint)sVar25 & 0x3ffffff);
                sVar25 = (local_b8.g)->strip[lVar33];
              } while (((uint)sVar25 & 0x7c000000) != 0x48000000);
            }
          }
          lVar31 = lVar33 + 1;
          switch((ulong)uVar10 - 0x4000000 >> 0x1a) {
          case 1:
          case 4:
          case 5:
            pcVar34 = pcVar34 + 1;
            break;
          case 8:
            pcVar21 = pcVar30;
            do {
              pcVar18 = lslow(&local_b8,pcVar34,pcVar21,lVar36,lVar31);
              pcVar16 = lslow(&local_b8,pcVar18,pcVar30,lVar31,stop);
              pcVar21 = pcVar18 + -1;
            } while (pcVar16 != pcVar30);
            lVar26 = lVar36 + 1;
            do {
              pcVar21 = lslow(&local_b8,pcVar34,pcVar18,lVar26,lVar33);
              lVar36 = lVar31;
              if (pcVar21 == (char *)0x0) break;
              bVar37 = pcVar21 != pcVar34;
              pcVar34 = pcVar21;
            } while (bVar37);
            goto joined_r0x00107ddb;
          case 10:
            pcVar21 = pcVar30;
            do {
              pcVar18 = lslow(&local_b8,pcVar34,pcVar21,lVar36,lVar31);
              pcVar16 = lslow(&local_b8,pcVar18,pcVar30,lVar31,stop);
              pcVar21 = pcVar18 + -1;
            } while (pcVar16 != pcVar30);
            lslow(&local_b8,pcVar34,pcVar18,lVar36 + 1,lVar33);
            lVar36 = lVar31;
            goto joined_r0x00107ddb;
          case 0xc:
            *(long *)((long)&(local_b8.pmatch)->rm_so + (ulong)((uVar8 & 0x3ffffff) << 4)) =
                 (long)pcVar34 - (long)local_b8.offp;
            break;
          case 0xd:
            *(long *)((long)&(local_b8.pmatch)->rm_eo + (ulong)((uVar8 & 0x3ffffff) << 4)) =
                 (long)pcVar34 - (long)local_b8.offp;
            break;
          case 0xe:
            goto switchD_00107e7b_caseD_e;
          }
          lVar36 = lVar31;
          pcVar18 = pcVar34;
          goto joined_r0x00107ddb;
        }
        goto LAB_0010810e;
      }
      lVar36 = prVar2->nplus;
      if ((regmatch_t *)local_b8.lastpos == (regmatch_t *)0x0 && 0 < lVar36) {
        local_b8.lastpos = (char **)malloc(lVar36 * 8 + 8);
      }
      if (lVar36 < 1 || (regmatch_t *)local_b8.lastpos != (regmatch_t *)0x0) {
        pcVar34 = lbackref(&local_b8,local_b8.coldp,pcVar30,lVar35,stop,0);
LAB_0010810e:
        do {
          if (pcVar34 != (char *)0x0) {
            if (uVar24 != 0) goto LAB_00108248;
            goto LAB_001082ac;
          }
          if (pcVar30 <= local_b8.coldp) goto LAB_00108169;
          pcVar30 = lslow(&local_b8,local_b8.coldp,pcVar30 + -1,lVar35,stop);
          if (pcVar30 == (char *)0x0) goto LAB_00108169;
          pcVar34 = lbackref(&local_b8,local_b8.coldp,pcVar30,lVar35,stop,0);
        } while( true );
      }
      iVar7 = 0xc;
      goto LAB_001082ca;
    }
    iVar7 = 0xc;
    prVar19 = (regmatch_t *)local_b8.space;
  }
  goto LAB_001082da;
switchD_00107e7b_caseD_e:
  pcVar21 = pcVar30;
  do {
    pcVar18 = lslow(&local_b8,pcVar34,pcVar21,lVar36,lVar31);
    pcVar16 = lslow(&local_b8,pcVar18,pcVar30,lVar31,stop);
    pcVar21 = pcVar18 + -1;
  } while (pcVar16 != pcVar30);
  lVar33 = lVar36 + (ulong)((uint)(local_b8.g)->strip[lVar36] & 0x3ffffff) + -1;
  pcVar21 = lslow(&local_b8,pcVar34,pcVar18,lVar36 + 1,lVar33);
  while (lVar36 = lVar31, pcVar21 != pcVar18) {
    uVar27 = (ulong)((uint)(local_b8.g)->strip[lVar33 + 1] & 0x3ffffff);
    lVar26 = uVar27 + lVar33 + 1;
    lVar36 = uVar27 + lVar33;
    if ((*(uint *)((local_b8.g)->strip + lVar26) & 0x7c000000) != 0x44000000) {
      lVar36 = lVar26;
    }
    pcVar21 = lslow(&local_b8,pcVar34,pcVar18,lVar33 + 2,lVar36);
    lVar33 = lVar36;
  }
  goto joined_r0x00107ddb;
LAB_00108248:
  *__pmatch = (regmatch_t)((long)local_b8.coldp - (long)local_b8.offp);
  __pmatch[1] = (regmatch_t)((long)pcVar30 - (long)local_b8.offp);
  if (1 < uVar24) {
    uVar27 = 1;
    lVar35 = 0x10;
    do {
      puVar32 = (undefined8 *)((long)&__pmatch->rm_so + lVar35);
      if ((local_b8.g)->nsub < uVar27) {
        *(undefined4 *)puVar32 = 0xffffffff;
        *(undefined4 *)((long)puVar32 + 4) = 0xffffffff;
        *(undefined4 *)(puVar32 + 1) = 0xffffffff;
        *(undefined4 *)((long)puVar32 + 0xc) = 0xffffffff;
      }
      else {
        pcVar30 = (char *)((long)&(local_b8.pmatch)->rm_so + lVar35);
        uVar5 = *(undefined8 *)(pcVar30 + 8);
        *puVar32 = *(undefined8 *)pcVar30;
        puVar32[1] = uVar5;
      }
      uVar27 = uVar27 + 1;
      lVar35 = lVar35 + 0x10;
    } while (uVar24 != uVar27);
  }
LAB_001082ac:
  if (local_b8.pmatch != (regmatch_t *)0x0) {
    free(local_b8.pmatch);
  }
  iVar7 = 0;
  __ptr = (regmatch_t *)local_b8.lastpos;
  prVar19 = (regmatch_t *)local_b8.space;
  if ((regmatch_t *)local_b8.lastpos != (regmatch_t *)0x0) {
LAB_001082ca:
    free(__ptr);
    prVar19 = (regmatch_t *)local_b8.space;
  }
  goto LAB_001082da;
LAB_00108169:
  pcVar30 = local_b8.coldp + 1;
  prVar19 = (regmatch_t *)CONCAT44(local_b8.st._4_4_,local_b8.st._0_4_);
  local_d8 = local_b8.tmp;
  pcVar18 = local_b8.fresh;
  pcVar34 = local_b8.beginp;
  goto LAB_001079e7;
LAB_001073ad:
  if ((local_3c & uVar10) == 0) {
    return 1;
  }
  local_b8.coldp = pcVar18;
  if ((local_48 == 0) && (prVar2->backrefs == 0)) goto LAB_0010820f;
  pcVar34 = sslow((smat *)&local_b8,pcVar18,pcVar13,lVar35,lVar36);
  while (pcVar34 == (char *)0x0) {
    pcVar18 = pcVar18 + 1;
    local_b8.coldp = pcVar18;
    pcVar34 = sslow((smat *)&local_b8,pcVar18,pcVar13,lVar35,lVar36);
  }
  if ((local_48 == 1) && (prVar2->backrefs == 0)) {
    *__pmatch = (regmatch_t)((long)pcVar18 - (long)local_b8.offp);
    __pmatch[1] = (regmatch_t)((long)pcVar34 - (long)local_b8.offp);
    goto LAB_0010820f;
  }
  sVar3 = prVar6->nsub;
  if ((local_b8.pmatch == (regmatch_t *)0x0) &&
     (local_b8.pmatch = (regmatch_t *)malloc(sVar3 * 0x10 + 0x10),
     local_b8.pmatch == (regmatch_t *)0x0)) {
    return 0xc;
  }
  prVar19 = local_b8.pmatch;
  if (sVar3 != 0) {
    memset(local_b8.pmatch + 1,0xff,sVar3 << 4);
  }
  pcVar30 = local_b8.offp;
  if ((iVar11 & 0x400U) == 0 && prVar2->backrefs == 0) {
    if (lVar35 < lVar36) {
      psVar4 = prVar6->strip;
      pcVar21 = pcVar18;
      lVar33 = lVar35;
      do {
        sVar25 = psVar4[lVar33];
        uVar10 = (uint)sVar25;
        uVar8 = uVar10 & 0x7c000000;
        if (((ulong)uVar8 == 0x24000000) || (uVar8 == 0x2c000000)) {
          lVar31 = (ulong)(uVar10 & 0x3ffffff) + lVar33;
        }
        else {
          lVar31 = lVar33;
          if (uVar8 == 0x3c000000) {
            do {
              lVar31 = lVar31 + (ulong)((uint)sVar25 & 0x3ffffff);
              sVar25 = psVar4[lVar31];
            } while (((uint)sVar25 & 0x7c000000) != 0x48000000);
          }
        }
        lVar26 = lVar31 + 1;
        pcVar18 = pcVar21;
        switch((ulong)uVar8 - 0x4000000 >> 0x1a) {
        case 1:
        case 4:
        case 5:
          pcVar18 = pcVar21 + 1;
          break;
        default:
          break;
        case 8:
          pcVar16 = pcVar34;
          do {
            pcVar18 = sslow((smat *)&local_b8,pcVar21,pcVar16,lVar33,lVar26);
            pcVar15 = sslow((smat *)&local_b8,pcVar18,pcVar34,lVar26,lVar36);
            pcVar16 = pcVar18 + -1;
          } while (pcVar15 != pcVar34);
          do {
            pcVar16 = sslow((smat *)&local_b8,pcVar21,pcVar18,lVar33 + 1,lVar31);
            if (pcVar16 == (char *)0x0) break;
            bVar37 = pcVar16 != pcVar21;
            pcVar21 = pcVar16;
          } while (bVar37);
          break;
        case 10:
          pcVar16 = pcVar34;
          do {
            pcVar18 = sslow((smat *)&local_b8,pcVar21,pcVar16,lVar33,lVar26);
            pcVar15 = sslow((smat *)&local_b8,pcVar18,pcVar34,lVar26,lVar36);
            pcVar16 = pcVar18 + -1;
          } while (pcVar15 != pcVar34);
          sslow((smat *)&local_b8,pcVar21,pcVar18,lVar33 + 1,lVar31);
          break;
        case 0xc:
          *(long *)((long)&prVar19->rm_so + (ulong)((uVar10 & 0x3ffffff) << 4)) =
               (long)pcVar21 - (long)pcVar30;
          break;
        case 0xd:
          *(long *)((long)&prVar19->rm_eo + (ulong)((uVar10 & 0x3ffffff) << 4)) =
               (long)pcVar21 - (long)pcVar30;
          break;
        case 0xe:
          pcVar16 = pcVar34;
          do {
            pcVar18 = sslow((smat *)&local_b8,pcVar21,pcVar16,lVar33,lVar26);
            pcVar15 = sslow((smat *)&local_b8,pcVar18,pcVar34,lVar26,lVar36);
            pcVar16 = pcVar18 + -1;
          } while (pcVar15 != pcVar34);
          lVar31 = lVar33 + (ulong)(uVar10 & 0x3ffffff) + -1;
          pcVar16 = sslow((smat *)&local_b8,pcVar21,pcVar18,lVar33 + 1,lVar31);
          while (pcVar16 != pcVar18) {
            uVar27 = (ulong)((uint)psVar4[lVar31 + 1] & 0x3ffffff);
            lVar17 = uVar27 + lVar31 + 1;
            lVar33 = uVar27 + lVar31;
            if ((*(uint *)(psVar4 + lVar17) & 0x7c000000) != 0x44000000) {
              lVar33 = lVar17;
            }
            pcVar16 = sslow((smat *)&local_b8,pcVar21,pcVar18,lVar31 + 2,lVar33);
            lVar31 = lVar33;
          }
        }
        pcVar21 = pcVar18;
        lVar33 = lVar26;
      } while (lVar26 < lVar36);
    }
  }
  else {
    lVar33 = prVar2->nplus;
    if ((regmatch_t *)local_b8.lastpos == (regmatch_t *)0x0 && 0 < lVar33) {
      local_b8.lastpos = (char **)malloc(lVar33 * 8 + 8);
    }
    if (0 < lVar33 && (regmatch_t *)local_b8.lastpos == (regmatch_t *)0x0) {
      iVar7 = 0xc;
      goto LAB_001082da;
    }
    pcVar18 = sbackref((smat *)&local_b8,pcVar18,pcVar34,lVar35,lVar36,0);
  }
  if (pcVar18 != (char *)0x0) goto LAB_00108196;
  while ((pcVar30 = local_b8.coldp, local_b8.coldp < pcVar34 &&
         (pcVar34 = sslow((smat *)&local_b8,local_b8.coldp,pcVar34 + -1,lVar35,lVar36),
         pcVar34 != (char *)0x0))) {
    pcVar30 = sbackref((smat *)&local_b8,pcVar30,pcVar34,lVar35,lVar36,0);
    if (pcVar30 != (char *)0x0) goto LAB_00108196;
  }
  pcVar30 = pcVar30 + 1;
  goto LAB_00107100;
LAB_00108196:
  if (local_48 != 0) {
    *__pmatch = (regmatch_t)((long)local_b8.coldp - (long)local_b8.offp);
    __pmatch[1] = (regmatch_t)((long)pcVar34 - (long)local_b8.offp);
    if (local_48 != 1) {
      uVar27 = 1;
      lVar35 = 0x10;
      do {
        puVar32 = (undefined8 *)((long)&__pmatch->rm_so + lVar35);
        if ((local_b8.g)->nsub < uVar27) {
          *(undefined4 *)puVar32 = 0xffffffff;
          *(undefined4 *)((long)puVar32 + 4) = 0xffffffff;
          *(undefined4 *)(puVar32 + 1) = 0xffffffff;
          *(undefined4 *)((long)puVar32 + 0xc) = 0xffffffff;
        }
        else {
          pcVar30 = (char *)((long)&(local_b8.pmatch)->rm_so + lVar35);
          uVar5 = *(undefined8 *)(pcVar30 + 8);
          *puVar32 = *(undefined8 *)pcVar30;
          puVar32[1] = uVar5;
        }
        uVar27 = uVar27 + 1;
        lVar35 = lVar35 + 0x10;
      } while (local_48 != uVar27);
    }
  }
LAB_0010820f:
  if (local_b8.pmatch != (regmatch_t *)0x0) {
    free(local_b8.pmatch);
  }
  iVar7 = 0;
  prVar19 = (regmatch_t *)local_b8.lastpos;
  if ((regmatch_t *)local_b8.lastpos == (regmatch_t *)0x0) {
    return 0;
  }
LAB_001082da:
  free(prVar19);
  return iVar7;
}

Assistant:

int				/* 0 success, REG_NOMATCH failure */
regexec(preg, string, nmatch, pmatch, eflags)
const regex_t *preg;
const char *string;
size_t nmatch;
regmatch_t pmatch[];
int eflags;
{
	register struct re_guts *g = preg->re_g;
#ifdef REDEBUG
#	define	GOODFLAGS(f)	(f)
#else
#	define	GOODFLAGS(f)	((f)&(REG_NOTBOL|REG_NOTEOL|REG_STARTEND))
#endif

	if (preg->re_magic != MAGIC1 || g->magic != MAGIC2)
		return(REG_BADPAT);
	assert(!(g->iflags&BAD));
	if (g->iflags&BAD)		/* backstop for no-debug case */
		return(REG_BADPAT);
	eflags = GOODFLAGS(eflags);

	if (g->nstates <= CHAR_BIT*sizeof(states1) && !(eflags&REG_LARGE))
		return(smatcher(g, (char *)string, nmatch, pmatch, eflags));
	else
		return(lmatcher(g, (char *)string, nmatch, pmatch, eflags));
}